

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O2

bool __thiscall pg::TLSolver::extractTangles(TLSolver *this,int startvertex,bitset *R,int *str)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  uint64_t *puVar4;
  Game *pGVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  size_t sVar8;
  pointer piVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint *puVar14;
  ostream *poVar15;
  byte bVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong *puVar20;
  int *piVar21;
  uint *puVar22;
  ulong uVar23;
  int *piVar24;
  int *piVar25;
  ulong uVar26;
  uint x;
  ulong uVar27;
  vector<int,_std::allocator<int>_> *__range5;
  uint uVar28;
  iterator __begin2;
  int *_tout;
  int local_90;
  int *local_88;
  int pr;
  int *local_78;
  uint local_6c;
  uint local_68;
  int tidx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  vector<int_*,_std::allocator<int_*>_> *local_58;
  vector<int_*,_std::allocator<int_*>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  bitset *local_40;
  int *_vv;
  
  uVar13 = (ulong)startvertex;
  pr = ((this->super_Solver).game)->_priority[uVar13];
  local_6c = pr & 1;
  iVar17 = (this->pea_state).pointer;
  puVar3 = (this->pea_state).queue;
  (this->pea_state).pointer = iVar17 + 1;
  puVar3[iVar17] = startvertex;
  iVar17 = (this->pea_state).pointer;
  (this->pea_state).pointer = iVar17 + 1;
  puVar3[iVar17] = 0;
  local_88 = (int *)0x0;
  puVar20 = (this->pea_root)._bits + (uVar13 >> 6);
  *puVar20 = *puVar20 | 1L << (uVar13 & 0x3f);
  uVar12 = this->pea_curidx;
  this->pea_curidx = uVar12 + 1;
  this->pea_vidx[uVar13] = uVar12;
  local_48 = &this->tpr;
  local_50 = &this->tout;
  local_58 = &this->tv;
  local_60 = &this->tescs;
  local_78 = str;
  local_40 = R;
LAB_0015bc59:
  do {
    if ((this->pea_state).pointer == 0) {
      (this->pea_S).pointer = 0;
      return (bool)((byte)local_88 & 1);
    }
LAB_0015bc67:
    puVar3 = (this->pea_state).queue;
    lVar18 = (long)(this->pea_state).pointer;
    uVar12 = puVar3[lVar18 + -2];
    uVar13 = (ulong)uVar12;
    uVar28 = puVar3[lVar18 + -1];
    uVar11 = Solver::owner(&this->super_Solver,uVar12);
    bVar16 = (byte)uVar12;
    if (uVar11 != local_6c) {
      pGVar5 = (this->super_Solver).game;
      puVar14 = this->pea_vidx;
      iVar17 = pGVar5->_firstouts[(int)uVar12];
      piVar25 = pGVar5->_outedges;
      if ((uVar28 != 0) && (puVar14[piVar25[(long)iVar17 + (ulong)(uVar28 - 1)]] < puVar14[uVar13]))
      {
        puVar14[uVar13] = puVar14[piVar25[(long)iVar17 + (ulong)(uVar28 - 1)]];
        puVar20 = (this->pea_root)._bits + (uVar12 >> 6);
        *puVar20 = *puVar20 &
                   (-2L << (bVar16 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar16 & 0x3f));
        puVar14 = this->pea_vidx;
      }
      puVar4 = (this->pea_root)._bits;
      uVar27 = (ulong)(uVar12 >> 6);
      uVar26 = 1L << (uVar13 & 0x3f);
      puVar6 = local_40->_bits;
      do {
        uVar1 = piVar25[(long)iVar17 + (ulong)uVar28];
        uVar23 = (ulong)(int)uVar1;
        if (uVar23 == 0xffffffffffffffff) goto LAB_0015be35;
        uVar19 = uVar23 >> 6;
        if ((puVar6[uVar19] >> (uVar23 & 0x3f) & 1) != 0) {
          uVar11 = puVar14[uVar23];
          if (uVar11 == 0) goto LAB_0015bdc1;
          if (uVar11 < puVar14[uVar13]) {
            puVar14[uVar13] = uVar11;
            puVar20 = puVar4 + uVar27;
            *puVar20 = *puVar20 &
                       (-2L << (bVar16 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar16 & 0x3f));
          }
        }
        uVar28 = uVar28 + 1;
      } while( true );
    }
    uVar1 = local_78[uVar13];
    puVar14 = this->pea_vidx;
    uVar23 = (ulong)(int)uVar1;
    uVar11 = puVar14[uVar23];
    if (uVar28 == 0 && uVar11 == 0) {
      puVar3 = (this->pea_state).queue;
      puVar14 = puVar14 + uVar23;
      puVar3[(long)(this->pea_state).pointer + -1] = 1;
      iVar17 = (this->pea_state).pointer;
      (this->pea_state).pointer = iVar17 + 1;
      puVar3[iVar17] = uVar1;
      iVar17 = (this->pea_state).pointer;
      (this->pea_state).pointer = iVar17 + 1;
      puVar3[iVar17] = 0;
      uVar19 = uVar23 >> 6;
      goto LAB_0015be10;
    }
    if (uVar11 < puVar14[uVar13]) {
      puVar14[uVar13] = uVar11;
      uVar27 = (ulong)(uVar12 >> 6);
      uVar26 = 1L << (uVar13 & 0x3f);
      puVar20 = (this->pea_root)._bits + uVar27;
      *puVar20 = *puVar20 & (-2L << (bVar16 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar16 & 0x3f))
      ;
    }
    else {
      uVar27 = (ulong)(uVar12 >> 6);
      uVar26 = 1L << (uVar13 & 0x3f);
    }
LAB_0015be35:
    piVar25 = &(this->pea_state).pointer;
    *piVar25 = *piVar25 + -2;
    if (((this->pea_root)._bits[uVar27] & uVar26) == 0) {
      iVar17 = (this->pea_S).pointer;
      (this->pea_S).pointer = iVar17 + 1;
      (this->pea_S).queue[iVar17] = uVar12;
      goto LAB_0015bc59;
    }
    this->pea_curidx = this->pea_curidx + -1;
    _tout = (int *)CONCAT44(_tout._4_4_,uVar12);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->tangle,(int *)&_tout);
    while( true ) {
      iVar17 = (this->pea_S).pointer;
      if ((long)iVar17 == 0) break;
      uVar28 = (this->pea_S).queue[(long)iVar17 + -1];
      _tout = (int *)CONCAT44(_tout._4_4_,uVar28);
      puVar14 = this->pea_vidx;
      if (puVar14[(int)uVar28] < puVar14[uVar13]) goto LAB_0015bed4;
      (this->pea_S).pointer = iVar17 + -1;
      this->pea_curidx = this->pea_curidx + -1;
      puVar14[(int)uVar28] = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->tangle,(value_type_conflict3 *)&_tout);
    }
    puVar14 = this->pea_vidx;
LAB_0015bed4:
    puVar14[uVar13] = 0xffffffff;
    piVar25 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    piVar24 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((long)piVar25 - (long)piVar24 == 4) && (local_78[uVar13] != uVar12)) {
      if (local_78[uVar13] == 0xffffffff) {
        bVar10 = Game::has_edge((this->super_Solver).game,uVar12,uVar12);
        piVar24 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar25 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (bVar10) goto LAB_0015bf71;
      }
      if (piVar25 != piVar24) {
        (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = piVar24;
      }
    }
    else {
LAB_0015bf71:
      puVar4 = (this->escapes)._bits;
      for (piVar21 = piVar24; piVar21 != piVar25; piVar21 = piVar21 + 1) {
        puVar20 = puVar4 + ((ulong)(long)*piVar21 >> 6);
        *puVar20 = *puVar20 | 1L << ((long)*piVar21 & 0x3fU);
      }
      for (; piVar24 != piVar25; piVar24 = piVar24 + 1) {
        iVar17 = *piVar24;
        uVar12 = Solver::owner(&this->super_Solver,iVar17);
        if (uVar12 != local_6c) {
          pGVar5 = (this->super_Solver).game;
          puVar3 = (this->tangleto).queue;
          puVar4 = (this->escapes)._bits;
          puVar6 = (this->S)._bits;
          puVar22 = (uint *)(pGVar5->_outedges + pGVar5->_firstouts[iVar17]);
          puVar7 = (this->G)._bits;
          while( true ) {
            uVar28 = *puVar22;
            uVar13 = (ulong)(int)uVar28;
            if (uVar13 == 0xffffffffffffffff) break;
            uVar27 = uVar13 >> 6;
            if ((((puVar7[uVar27] >> (uVar13 & 0x3f) & 1) != 0) &&
                (uVar13 = 1L << (uVar13 & 0x3f), (puVar6[uVar27] & uVar13) == 0)) &&
               (uVar26 = puVar4[uVar27], (uVar26 & uVar13) == 0)) {
              puVar4[uVar27] = uVar26 | uVar13;
              iVar17 = (this->tangleto).pointer;
              (this->tangleto).pointer = iVar17 + 1;
              puVar3[iVar17] = uVar28;
            }
            puVar22 = puVar22 + 1;
          }
        }
      }
      piVar25 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      piVar24 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar13 = (ulong)(uint)(this->tangleto).pointer;
      if (((long)piVar25 - (long)piVar24 >> 2) + uVar13 < (this->escapes)._size >> 6) {
        puVar3 = (this->tangleto).queue;
        puVar4 = (this->escapes)._bits;
        for (uVar27 = 0; uVar13 != uVar27; uVar27 = uVar27 + 1) {
          uVar12 = puVar3[uVar27];
          bVar16 = (byte)uVar12 & 0x3f;
          puVar20 = puVar4 + (uVar12 >> 6);
          *puVar20 = *puVar20 & (-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
        }
        puVar4 = (this->escapes)._bits;
        for (; piVar24 != piVar25; piVar24 = piVar24 + 1) {
          bVar16 = (byte)*piVar24 & 0x3f;
          puVar20 = puVar4 + ((ulong)(long)*piVar24 >> 6);
          *puVar20 = *puVar20 & (-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
        }
      }
      else {
        sVar8 = (this->escapes)._bitssize;
        puVar4 = (this->escapes)._bits;
        for (lVar18 = 0; sVar8 << 3 != lVar18; lVar18 = lVar18 + 8) {
          *(undefined8 *)((long)puVar4 + lVar18) = 0;
        }
      }
      iVar17 = (this->super_Solver).trace;
      if (uVar13 == 0) {
        if (iVar17 != 0) {
          poVar15 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;201mdominion \x1b[36m")
          ;
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,pr);
          std::operator<<(poVar15,"\x1b[m");
          if (1 < (this->super_Solver).trace) {
            local_88 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            for (piVar25 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar25 != local_88;
                piVar25 = piVar25 + 1) {
              iVar17 = *piVar25;
              poVar15 = std::operator<<((this->super_Solver).logger," \x1b[1;36m");
              _tout = (int *)(this->super_Solver).game;
              local_90 = iVar17;
              poVar15 = operator<<(poVar15,(_label_vertex *)&_tout);
              std::operator<<(poVar15,"\x1b[m");
              piVar24 = local_78;
              if (local_78[iVar17] != -1) {
                poVar15 = std::operator<<((this->super_Solver).logger,"->");
                local_90 = piVar24[iVar17];
                _tout = (int *)(this->super_Solver).game;
                operator<<(poVar15,(_label_vertex *)&_tout);
              }
            }
          }
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        }
        piVar24 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        puVar4 = (this->S)._bits;
        piVar25 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (piVar21 = piVar25; piVar21 != piVar24; piVar21 = piVar21 + 1) {
          puVar20 = puVar4 + ((ulong)(long)*piVar21 >> 6);
          *puVar20 = *puVar20 | 1L << ((long)*piVar21 & 0x3fU);
        }
        this->dominions = this->dominions + 1;
        local_88 = (int *)CONCAT71((int7)((ulong)puVar4 >> 8),1);
        if (piVar24 != piVar25) {
          (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar25;
        }
      }
      else {
        if (0 < iVar17) {
          poVar15 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;198mnew tangle ");
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,pr);
          poVar15 = std::operator<<(poVar15,"\x1b[m (");
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
          std::operator<<(poVar15,")");
          if (1 < (this->super_Solver).trace) {
            local_88 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            for (piVar25 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar25 != local_88;
                piVar25 = piVar25 + 1) {
              iVar17 = *piVar25;
              poVar15 = std::operator<<((this->super_Solver).logger," \x1b[1;36m");
              _tout = (int *)(this->super_Solver).game;
              local_90 = iVar17;
              poVar15 = operator<<(poVar15,(_label_vertex *)&_tout);
              std::operator<<(poVar15,"\x1b[m");
              piVar24 = local_78;
              if (local_78[iVar17] != -1) {
                poVar15 = std::operator<<((this->super_Solver).logger,"->");
                local_90 = piVar24[iVar17];
                _tout = (int *)(this->super_Solver).game;
                operator<<(poVar15,(_label_vertex *)&_tout);
              }
            }
          }
          poVar15 = std::operator<<((this->super_Solver).logger," with ");
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
          std::operator<<(poVar15," escape vertices.");
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        }
        uVar13 = 0;
        tidx = (int)((ulong)((long)(this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                            (long)(this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
        while( true ) {
          uVar12 = (this->tangleto).pointer;
          if (uVar12 <= uVar13) break;
          std::vector<int,_std::allocator<int>_>::push_back
                    (this->tin + (this->tangleto).queue[uVar13],&tidx);
          uVar13 = uVar13 + 1;
        }
        _tout = (int *)operator_new__((ulong)(uVar12 + 1) << 2);
        puVar14 = (this->tangleto).queue;
        std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<unsigned_int*,int*>
                  (puVar14,puVar14 + uVar12,_tout);
        _tout[(uint)(this->tangleto).pointer] = -1;
        std::vector<int_*,_std::allocator<int_*>_>::push_back(local_50,&_tout);
        piVar25 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        piVar24 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar18 = (long)piVar25 - (long)piVar24;
        _vv = (int *)operator_new__(-(ulong)((lVar18 >> 2 & 0x6000000000000000U) != 0) |
                                    lVar18 * 2 + 4U);
        piVar21 = _vv + 1;
        iVar17 = 0;
        for (; piVar24 != piVar25; piVar24 = piVar24 + 1) {
          iVar2 = *piVar24;
          iVar17 = iVar17 + -2;
          piVar21[-1] = iVar2;
          *piVar21 = local_78[iVar2];
          piVar21 = piVar21 + 2;
        }
        _vv[(uint)-iVar17] = -1;
        std::vector<int_*,_std::allocator<int_*>_>::push_back(local_58,&_vv);
        std::vector<int,_std::allocator<int>_>::push_back(local_48,&pr);
        local_68 = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (local_60,&local_68);
        this->tangles = this->tangles + 1;
        piVar9 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar9) {
          (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar9;
        }
        (this->tangleto).pointer = 0;
        local_88 = (int *)CONCAT71((int7)((ulong)piVar9 >> 8),1);
      }
    }
  } while( true );
LAB_0015bdc1:
  puVar14 = puVar14 + uVar23;
  puVar3 = (this->pea_state).queue;
  puVar3[(long)(this->pea_state).pointer + -1] = uVar28 + 1;
  iVar17 = (this->pea_state).pointer;
  (this->pea_state).pointer = iVar17 + 1;
  puVar3[iVar17] = uVar1;
  iVar17 = (this->pea_state).pointer;
  (this->pea_state).pointer = iVar17 + 1;
  puVar3[iVar17] = 0;
LAB_0015be10:
  puVar20 = (this->pea_root)._bits + uVar19;
  *puVar20 = *puVar20 | 1L << (uVar23 & 0x3f);
  uVar12 = this->pea_curidx;
  this->pea_curidx = uVar12 + 1;
  *puVar14 = uVar12;
  goto LAB_0015bc67;
}

Assistant:

bool
TLSolver::extractTangles(int startvertex, bitset &R, int *str)
{
    bool new_tangles = false;
    const int pr = priority(startvertex);
    const int pl = pr&1;

    /**
     * The following is the nonrecursive implementation of David Pearce,
     * "A space-efficient algorithm for finding strongly connected components" (IPL, 2016),
     * modified to on-the-fly restrict the graph by <R> and <str>.
     */

    // beginVisiting
    pea_state.push(startvertex);
    pea_state.push(0);
    pea_root[startvertex] = true;
    pea_vidx[startvertex] = pea_curidx++;
    while (pea_state.nonempty()) {
pearce_again:
        // visitLoop
        const unsigned int n = pea_state.back2();
        unsigned int i = pea_state.back();

        if (owner(n) != pl) {
            auto edges = outs(n);
            if (i>0) {
                // finishEdge
                const int w = edges[i-1];
                if (pea_vidx[w] < pea_vidx[n]) {
                    pea_vidx[n] = pea_vidx[w];
                    pea_root[n] = false;
                }
            }
            for (;;) {
                const int to = edges[i];
                if (to == -1) break; // done
                // beginEdge
                if (R[to]) {
                    if (pea_vidx[to] == 0) {
                        pea_state.back() = i+1;
                        // beginVisiting
                        pea_state.push(to);
                        pea_state.push(0);
                        pea_root[to] = true;
                        pea_vidx[to] = pea_curidx++;
                        goto pearce_again; // break; continue;
                    } else {
                        // finishEdge
                        if (pea_vidx[to] < pea_vidx[n]) {
                            pea_vidx[n] = pea_vidx[to];
                            pea_root[n] = false;
                        }
                    }
                }
                i++;
            }
        } else {
            const int s = str[n];
            if (i == 0) {
                // beginEdge
                if (pea_vidx[s] == 0) {
                    pea_state.back() = 1;
                    // beginVisiting
                    pea_state.push(s);
                    pea_state.push(0);
                    pea_root[s] = true;
                    pea_vidx[s] = pea_curidx++;
                    goto pearce_again; // break; continue;
                }
            }
            // finishEdge
            if (pea_vidx[s] < pea_vidx[n]) {
                pea_vidx[n] = pea_vidx[s];
                pea_root[n] = false;
            }
        }
        // finishVisiting
        pea_state.pop2();
        if (pea_root[n]) {
            pea_curidx -= 1;
            tangle.push_back(n);
            while (pea_S.nonempty()) {
                const int t = pea_S.back();
                if (pea_vidx[n]>pea_vidx[t]) break;
                pea_S.pop();
                pea_curidx -= 1;
                pea_vidx[t] = (unsigned int)-1;
                tangle.push_back(t);
            }
            pea_vidx[n] = (unsigned int)-1;
        } else {
            pea_S.push(n);
            continue;
        }

        /**
         * End of Pearce's algorithm.
         * At this point, we have an SCC in <tangle>.
         *
         * Now check if the SCC is nontrivial, i.e., contains a cycle, i.e., either 2+ vertices
         * or a self-loop.
         */

        const bool is_not_tangle = (tangle.size() == 1) and
            ((unsigned int)str[n] != n) and (str[n] != -1 or !game.has_edge(n, n));
        if (is_not_tangle) {
            // std::cout << "not a tangle: " << pea_vidx[n] << std::endl;
            tangle.clear();
            continue;
        }

        /**
         * We have a tangle. Compute the outgoing edges (into <tangleto>) and the next highest region.
         */

        for (const int v : tangle) escapes[v] = true;

        for (const int v : tangle) {
            if (owner(v) != pl) {
                for (auto curedge = outs(v); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !S[to] && !escapes[to]) {
                        escapes[to] = true;
                        tangleto.push(to);
                    }
                }
            }
        }

        if ((tangle.size()+tangleto.size()) < (escapes.size()/64)) {
            for (unsigned int x = 0; x < tangleto.size(); x++) escapes[tangleto[x]] = false;
            for (const int v : tangle) escapes[v] = false;
        } else {
            escapes.reset(); // this is very expensive on large practical games with many small tangles
        }

        /**
         * If there are no outgoing edges, then we have found a dominion.
         */

        if (tangleto.empty()) {
            // dominion
#ifndef NDEBUG
            if (trace) {
                logger << "\033[1;38;5;201mdominion \033[36m" << pr << "\033[m";
                if (trace >= 2) {
                    for (const int v : tangle) {
                        logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                        if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                    }
                }
                logger << std::endl;
            }
#endif
            for (const int v : tangle) S[v] = true;
            dominions++;
            tangle.clear();
            new_tangles = true;
            continue;
        }

        /**
         * We're not a dominion, we're a tangle.
         */

#ifndef NDEBUG
        if (trace >= 1) {
            logger << "\033[1;38;5;198mnew tangle " << pr << "\033[m (" << tpr.size() << ")";
            if (trace >= 2) {
                for (const int v : tangle) {
                    logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                }
            }
            logger << " with " << tangleto.size() << " escape vertices.";
            logger << std::endl;
        }
#endif

        // new tangle idx
        const int tidx = tpr.size();

        // add back links to all normal vertices in our [out]
        for (unsigned int x = 0; x < tangleto.size(); x++) tin[tangleto[x]].push_back(tidx);

        // move tangleto into vout
        int* _tout = new int[tangleto.size()+1];
        std::copy(&tangleto[0], &tangleto[tangleto.size()], _tout);
        _tout[tangleto.size()] = -1;
        tout.push_back(_tout);

        // move tangle into vv
        int* _vv = new int[tangle.size()*2+1], c=0;
        for (const int v : tangle) {
            _vv[c++] = v;
            _vv[c++] = str[v];
        }
        _vv[c] = -1;
        tv.push_back(_vv);

        // and set p to pr
        tpr.push_back(pr);
        tescs.push_back(0);

        tangles++;
        tangle.clear();
        tangleto.clear();
        new_tangles = true;
    }

    pea_S.clear();
    return new_tangles;
}